

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O3

bool LookupHelper<std::map<XOnlyPubKey,TaprootBuilder,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,TaprootBuilder>>>,XOnlyPubKey,TaprootBuilder>
               (map<XOnlyPubKey,_TaprootBuilder,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
                *map,XOnlyPubKey *key,TaprootBuilder *value)

{
  long lVar1;
  const_iterator cVar2;
  long lVar3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  XOnlyPubKey *pXVar6;
  long in_FS_OFFSET;
  byte bVar7;
  
  bVar7 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = std::
          _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
          ::find(&map->_M_t,key);
  p_Var4 = &(map->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node != p_Var4) {
    value->m_valid = SUB41(cVar2._M_node[2]._M_color,0);
    std::
    vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ::operator=(&value->m_branch,
                (vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                 *)&cVar2._M_node[2]._M_parent);
    p_Var5 = cVar2._M_node + 3;
    pXVar6 = &value->m_internal_key;
    for (lVar3 = 8; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined8 *)(pXVar6->m_keydata).super_base_blob<256U>.m_data._M_elems =
           *(undefined8 *)p_Var5;
      p_Var5 = (_Base_ptr)((long)p_Var5 + (ulong)bVar7 * -0x10 + 8);
      pXVar6 = (XOnlyPubKey *)((long)pXVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    value->m_parity = SUB41(cVar2._M_node[5]._M_color,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Rb_tree_header *)cVar2._M_node != p_Var4;
  }
  __stack_chk_fail();
}

Assistant:

bool LookupHelper(const M& map, const K& key, V& value)
{
    auto it = map.find(key);
    if (it != map.end()) {
        value = it->second;
        return true;
    }
    return false;
}